

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  string *source;
  char *pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  cmGeneratedFileStream *pcVar6;
  long lVar7;
  char *pcVar8;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  string local_298;
  undefined1 local_278 [584];
  
  this_00 = this->Makefile;
  pcVar1 = local_278 + 0x10;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"CMAKE_MAKE_INCLUDE_FROM_ROOT","");
  bVar3 = cmMakefile::IsOn(this_00,(string *)local_278);
  pcVar8 = "";
  if (bVar3) {
    pcVar8 = "$(CMAKE_BINARY_DIR)/";
  }
  if ((char *)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  pcVar2 = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar2,pcVar2 + (this->TargetBuildDirectoryFull)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_298);
  pcVar6 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar6,"# Include any dependencies generated for this target.\n",0x36);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar6,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p,
                      (this->GlobalGenerator->IncludeDirective)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  lVar7 = 0x14;
  if (!bVar3) {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
  cmOutputConverter::Convert
            ((string *)local_278,
             &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,&local_298,
             HOME_OUTPUT,MAKERULE);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_278._0_8_,local_278._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
  if ((char *)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (this->NoRuleMessages == false) {
    pcVar6 = this->BuildFileStream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar6,"# Include the progress variables for this target.\n",0x32);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar6,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
    cmOutputConverter::Convert
              ((string *)local_278,
               &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &this->ProgressFileNameFull,HOME_OUTPUT,MAKERULE);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
    if ((char *)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
  }
  bVar4 = cmsys::SystemTools::FileExists(local_298._M_dataplus._M_p);
  if (!bVar4) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,local_298._M_dataplus._M_p,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# Empty dependencies file for ",0x1e);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"# This may be replaced when dependencies are built.",0x33);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  }
  source = &this->FlagFileNameFull;
  std::__cxx11::string::_M_assign((string *)source);
  std::__cxx11::string::append((char *)source);
  pcVar6 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream(pcVar6,(source->_M_dataplus)._M_p,false);
  this->FlagFileStream = pcVar6;
  cmGeneratedFileStream::SetCopyIfDifferent(pcVar6,true);
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    pcVar6 = this->BuildFileStream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar6,"# Include the compile flags for this target\'s objects.\n",0x37);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar6,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    lVar7 = 0x14;
    if (!bVar3) {
      lVar7 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
    cmOutputConverter::Convert
              ((string *)local_278,
               &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,source,
               HOME_OUTPUT,MAKERULE);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
    if ((char *)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")?
                      "$(CMAKE_BINARY_DIR)/" : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(dependFileNameFull,
                     cmLocalGenerator::HOME_OUTPUT,
                     cmLocalGenerator::MAKERULE)
    << "\n\n";

  if(!this->NoRuleMessages)
    {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << this->Convert(this->ProgressFileNameFull,
                       cmLocalGenerator::HOME_OUTPUT,
                       cmLocalGenerator::MAKERULE)
      << "\n\n";
    }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str()))
    {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(dependFileNameFull.c_str());
    depFileStream
      << "# Empty dependencies file for " << this->Target->GetName() << ".\n"
      << "# This may be replaced when dependencies are built." << std::endl;
    }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if(!this->FlagFileStream)
    {
    return;
    }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(this->FlagFileNameFull,
                                     cmLocalGenerator::HOME_OUTPUT,
                                     cmLocalGenerator::MAKERULE)
    << "\n\n";
}